

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

void VaxpyVectorArray_Serial(int nvec,sunrealtype a,N_Vector *X,N_Vector *Y)

{
  long lVar1;
  long lVar2;
  long lVar3;
  sunrealtype *yd;
  sunrealtype *xd;
  sunindextype N;
  sunindextype j;
  int i;
  N_Vector *Y_local;
  N_Vector *X_local;
  sunrealtype a_local;
  int nvec_local;
  
  lVar1 = *(*X)->content;
  if ((a != 1.0) || (NAN(a))) {
    if ((a != -1.0) || (NAN(a))) {
      for (i = 0; i < nvec; i = i + 1) {
        lVar2 = *(long *)((long)X[i]->content + 0x10);
        lVar3 = *(long *)((long)Y[i]->content + 0x10);
        for (j = 0; j < lVar1; j = j + 1) {
          *(double *)(lVar3 + j * 8) = a * *(double *)(lVar2 + j * 8) + *(double *)(lVar3 + j * 8);
        }
      }
    }
    else {
      for (i = 0; i < nvec; i = i + 1) {
        lVar2 = *(long *)((long)X[i]->content + 0x10);
        lVar3 = *(long *)((long)Y[i]->content + 0x10);
        for (j = 0; j < lVar1; j = j + 1) {
          *(double *)(lVar3 + j * 8) = *(double *)(lVar3 + j * 8) - *(double *)(lVar2 + j * 8);
        }
      }
    }
  }
  else {
    for (i = 0; i < nvec; i = i + 1) {
      lVar2 = *(long *)((long)X[i]->content + 0x10);
      lVar3 = *(long *)((long)Y[i]->content + 0x10);
      for (j = 0; j < lVar1; j = j + 1) {
        *(double *)(lVar3 + j * 8) = *(double *)(lVar2 + j * 8) + *(double *)(lVar3 + j * 8);
      }
    }
  }
  return;
}

Assistant:

static void VaxpyVectorArray_Serial(int nvec, sunrealtype a, N_Vector* X,
                                    N_Vector* Y)
{
  int i;
  sunindextype j, N;
  sunrealtype* xd = NULL;
  sunrealtype* yd = NULL;

  N = NV_LENGTH_S(X[0]);

  if (a == ONE)
  {
    for (i = 0; i < nvec; i++)
    {
      xd = NV_DATA_S(X[i]);
      yd = NV_DATA_S(Y[i]);
      for (j = 0; j < N; j++) { yd[j] += xd[j]; }
    }
    return;
  }

  if (a == -ONE)
  {
    for (i = 0; i < nvec; i++)
    {
      xd = NV_DATA_S(X[i]);
      yd = NV_DATA_S(Y[i]);
      for (j = 0; j < N; j++) { yd[j] -= xd[j]; }
    }
    return;
  }

  for (i = 0; i < nvec; i++)
  {
    xd = NV_DATA_S(X[i]);
    yd = NV_DATA_S(Y[i]);
    for (j = 0; j < N; j++) { yd[j] += a * xd[j]; }
  }
}